

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communication.hpp
# Opt level: O1

void __thiscall diy::Master::InFlightRecv::reset(InFlightRecv *this)

{
  MemoryManagement *__x;
  vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_> *pvVar1;
  Deallocate *__x_00;
  MemCopy *__x_01;
  MemoryManagement mem_;
  _Any_data local_168;
  code *local_158;
  _Any_data local_148;
  code *local_138;
  _Any_data local_128;
  code *local_118;
  undefined1 local_108 [16];
  pointer local_f8;
  undefined **local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  undefined1 auStack_c0 [8];
  undefined1 local_b8 [16];
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined1 uStack_94;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  __x = &this->mem;
  std::function<char_*(int,_unsigned_long)>::function
            ((function<char_*(int,_unsigned_long)> *)&local_168,&__x->allocate);
  __x_00 = &(this->mem).deallocate;
  std::function<void_(const_char_*)>::function((function<void_(const_char_*)> *)&local_148,__x_00);
  __x_01 = &(this->mem).copy;
  std::function<void_(char_*,_const_char_*,_unsigned_long)>::function
            ((function<void_(char_*,_const_char_*,_unsigned_long)> *)&local_128,__x_01);
  memset(&local_f0,0,0xc0);
  local_f0 = &PTR__MemoryBuffer_00159230;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  _local_c8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_a8 = 0xffffffff;
  uStack_a4 = 0xffffffff;
  uStack_a0 = 0xffffffff;
  uStack_9c = 0xffffffff;
  uStack_98 = 0xffffffff;
  uStack_94 = 0;
  local_90 = (_Any_data)0x0;
  local_78 = std::
             _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
             ::_M_manager;
  local_70 = (_Any_data)0x0;
  local_58 = std::
             _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
             ::_M_manager;
  local_50 = (_Any_data)0x0;
  local_38 = std::
             _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
             ::_M_manager;
  (this->message).position = 0;
  std::vector<char,_std::allocator<char>_>::_M_move_assign(&(this->message).buffer,local_e8 + 8);
  (this->message).blob_position = (size_t)local_c8;
  pvVar1 = &(this->message).blobs;
  local_108._0_8_ =
       (pvVar1->super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_108._8_8_ =
       (pvVar1->super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_f8 = (this->message).blobs.
             super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  (this->message).blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_c0;
  (this->message).blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_b8._0_8_;
  (this->message).blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._8_8_;
  auStack_c0 = (undefined1  [8])0x0;
  local_b8 = ZEXT816(0);
  std::vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>::~vector
            ((vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_> *)local_108);
  *(ulong *)((long)&(this->info).round + 1) =
       CONCAT17(uStack_94,CONCAT43(uStack_98,uStack_9c._1_3_));
  (this->info).from = local_a8;
  (this->info).to = uStack_a4;
  (this->info).nparts = uStack_a0;
  (this->info).round = uStack_9c;
  std::function<char_*(int,_unsigned_long)>::operator=
            (&__x->allocate,(function<char_*(int,_unsigned_long)> *)&local_90);
  std::function<void_(const_char_*)>::operator=
            (&(this->mem).deallocate,(function<void_(const_char_*)> *)&local_70);
  std::function<void_(char_*,_const_char_*,_unsigned_long)>::operator=
            (&(this->mem).copy,(function<void_(char_*,_const_char_*,_unsigned_long)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  local_f0 = &PTR__MemoryBuffer_00159230;
  std::vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>::~vector
            ((vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_> *)(local_c8 + 8));
  if ((void *)local_e8._8_8_ != (void *)0x0) {
    operator_delete((void *)local_e8._8_8_,local_d8._8_8_ - local_e8._8_8_);
  }
  std::function<char_*(int,_unsigned_long)>::operator=
            (&__x->allocate,(function<char_*(int,_unsigned_long)> *)&local_168);
  std::function<void_(const_char_*)>::operator=(__x_00,(function<void_(const_char_*)> *)&local_148);
  std::function<void_(char_*,_const_char_*,_unsigned_long)>::operator=
            (__x_01,(function<void_(char_*,_const_char_*,_unsigned_long)> *)&local_128);
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,__destroy_functor);
  }
  if (local_158 != (code *)0x0) {
    (*local_158)(&local_168,&local_168,__destroy_functor);
  }
  return;
}

Assistant:

void            reset()
        {
            MemoryManagement mem_ = mem;
            *this = InFlightRecv();
            mem = mem_;
        }